

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::FunctionCallArgs(SQCompiler *this,bool rawcall)

{
  byte bVar1;
  SQInteger arg1;
  SQInteger arg2;
  byte in_SIL;
  SQCompiler *in_RDI;
  SQInteger closure;
  SQInteger stackbase;
  SQInteger i;
  SQInteger nargs;
  SQCompiler *in_stack_00000080;
  SQCompiler *in_stack_ffffffffffffffc0;
  SQCompiler *in_stack_ffffffffffffffd0;
  long arg0;
  long lVar2;
  SQOpcode _op;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  lVar2 = 1;
  while (in_RDI->_token != 0x29) {
    Expression(in_stack_00000080);
    MoveIfCurrentTargetIsLocal(in_stack_ffffffffffffffd0);
    lVar2 = lVar2 + 1;
    if ((in_RDI->_token == 0x2c) && (Lex(in_stack_ffffffffffffffc0), in_RDI->_token == 0x29)) {
      Error(in_RDI,"expression expected, found \')\'");
    }
  }
  Lex(in_stack_ffffffffffffffc0);
  if ((bVar1 & 1) != 0) {
    if (lVar2 < 3) {
      Error(in_RDI,"rawcall requires at least 2 parameters (callee and this)");
    }
    lVar2 = lVar2 + -2;
  }
  for (arg0 = 0; arg0 < lVar2 + -1; arg0 = arg0 + 1) {
    SQFuncState::PopTarget((SQFuncState *)in_stack_ffffffffffffffd0);
  }
  arg1 = SQFuncState::PopTarget((SQFuncState *)in_stack_ffffffffffffffd0);
  _op = (SQOpcode)((ulong)lVar2 >> 0x20);
  arg2 = SQFuncState::PopTarget((SQFuncState *)in_stack_ffffffffffffffd0);
  SQFuncState::PushTarget((SQFuncState *)in_RDI,(SQInteger)in_RDI->_fs);
  SQFuncState::AddInstruction
            ((SQFuncState *)CONCAT17(bVar1,in_stack_fffffffffffffff0),_op,arg0,arg1,arg2,
             (SQInteger)in_RDI);
  return;
}

Assistant:

void FunctionCallArgs(bool rawcall = false)
    {
        SQInteger nargs = 1;//this
         while(_token != _SC(')')) {
             Expression();
             MoveIfCurrentTargetIsLocal();
             nargs++;
             if(_token == _SC(',')){
                 Lex();
                 if(_token == ')') Error(_SC("expression expected, found ')'"));
             }
         }
         Lex();
         if (rawcall) {
             if (nargs < 3) Error(_SC("rawcall requires at least 2 parameters (callee and this)"));
             nargs -= 2; //removes callee and this from count
         }
         for(SQInteger i = 0; i < (nargs - 1); i++) _fs->PopTarget();
         SQInteger stackbase = _fs->PopTarget();
         SQInteger closure = _fs->PopTarget();
         _fs->AddInstruction(_OP_CALL, _fs->PushTarget(), closure, stackbase, nargs);
    }